

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::removeInternalVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *this_00;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar1;
  undefined1 local_68 [16];
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_58;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._12_4_ = 0xaaaaaaaa;
  local_58.second = edge;
  this_00 = &this->m_vertexList;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.first = item;
  pVar1 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_58);
  local_68._0_8_ = pVar1.first;
  local_68._8_4_ = pVar1.second;
  if ((AnchorVertex *)local_68._0_8_ == (AnchorVertex *)0x0) {
    removeInternalVertex();
  }
  else {
    local_68._8_4_ = pVar1.second + -1;
    if (local_68._8_4_ == 0) {
      QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
      ::removeImpl<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                ((QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                  *)this_00,&local_58);
      if ((AnchorVertex *)local_68._0_8_ != (AnchorVertex *)0x0) {
        (*(*(_func_int ***)local_68._0_8_)[1])();
      }
    }
    else {
      local_48.first = local_58.first;
      local_48.second = local_58.second;
      local_48._12_4_ = local_58._12_4_;
      QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
      ::emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
                ((QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                  *)this_00,&local_48,(pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *)local_68)
      ;
      if ((local_68._8_4_ == 2) &&
         ((edge == AnchorVerticalCenter || (edge == AnchorHorizontalCenter)))) {
        removeCenterAnchors(this,item,edge,true);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeInternalVertex(QGraphicsLayoutItem *item,
                                                        Qt::AnchorPoint edge)
{
    std::pair<QGraphicsLayoutItem *, Qt::AnchorPoint> pair(item, edge);
    std::pair<AnchorVertex *, int> v = m_vertexList.value(pair);

    if (!v.first) {
        qWarning("This item with this edge is not in the graph");
        return;
    }

    v.second--;
    if (v.second == 0) {
        // Remove reference and delete vertex
        m_vertexList.remove(pair);
        delete v.first;
    } else {
        // Update reference count
        m_vertexList.insert(pair, v);

        if ((v.second == 2) &&
            ((edge == Qt::AnchorHorizontalCenter) ||
             (edge == Qt::AnchorVerticalCenter))) {
            removeCenterAnchors(item, edge, true);
        }
    }
}